

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaStg.c
# Opt level: O0

Gia_Man_t * Gia_ManStgOneHot(Vec_Int_t *vLines,int nIns,int nOuts,int nStates)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Gia_Man_t *p_00;
  char *pcVar5;
  Vec_Int_t *pVVar6;
  Vec_Int_t *p_01;
  Vec_Vec_t *p_02;
  Vec_Vec_t *p_03;
  Gia_Man_t *p_04;
  byte bVar7;
  int iOut;
  int iNext;
  int iCur;
  int iMint;
  int Lit;
  int LitC;
  int b;
  int i;
  Vec_Vec_t *vLitsOuts;
  Vec_Vec_t *vLitsNext;
  Vec_Int_t *vVec;
  Vec_Int_t *vCurs;
  Vec_Int_t *vInMints;
  Gia_Man_t *pTemp;
  Gia_Man_t *p;
  int nStates_local;
  int nOuts_local;
  int nIns_local;
  Vec_Int_t *vLines_local;
  
  iVar1 = Vec_IntSize(vLines);
  if (iVar1 % 4 != 0) {
    __assert_fail("Vec_IntSize(vLines) % 4 == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaStg.c"
                  ,0x143,"Gia_Man_t *Gia_ManStgOneHot(Vec_Int_t *, int, int, int)");
  }
  p_00 = Gia_ManStart(10000);
  pcVar5 = Abc_UtilStrsav("stg");
  p_00->pName = pcVar5;
  for (LitC = 0; LitC < nIns + nStates; LitC = LitC + 1) {
    Gia_ManAppendCi(p_00);
  }
  Gia_ManHashAlloc(p_00);
  bVar7 = (byte)nIns;
  pVVar6 = Vec_IntAlloc(1 << (bVar7 & 0x1f));
  for (LitC = 0; LitC < 1 << (bVar7 & 0x1f); LitC = LitC + 1) {
    iCur = 1;
    for (Lit = 0; Lit < nIns; Lit = Lit + 1) {
      iVar1 = Abc_Var2Lit(Lit + 1,(uint)(((LitC >> ((byte)Lit & 0x1f) & 1U) != 0 ^ 0xffU) & 1));
      iCur = Gia_ManHashAnd(p_00,iCur,iVar1);
    }
    Vec_IntPush(pVVar6,iCur);
  }
  p_01 = Vec_IntAlloc(nStates);
  for (LitC = 0; LitC < nStates; LitC = LitC + 1) {
    iVar1 = Abc_Var2Lit(nIns + 1 + LitC,(uint)((LitC != 0 ^ 0xffU) & 1));
    Vec_IntPush(p_01,iVar1);
  }
  p_02 = Vec_VecStart(nStates);
  p_03 = Vec_VecStart(nOuts);
  LitC = 0;
  while( true ) {
    iVar1 = Vec_IntSize(vLines);
    if (iVar1 <= LitC) {
      Vec_IntFree(pVVar6);
      Vec_IntFree(p_01);
      for (LitC = 0; iVar1 = Vec_VecSize(p_03), LitC < iVar1; LitC = LitC + 1) {
        pVVar6 = Vec_VecEntryInt(p_03,LitC);
        iVar1 = Gia_ManCreateOrGate(p_00,pVVar6);
        Gia_ManAppendCo(p_00,iVar1);
      }
      Vec_VecFree(p_03);
      for (LitC = 0; iVar1 = Vec_VecSize(p_02), LitC < iVar1; LitC = LitC + 1) {
        pVVar6 = Vec_VecEntryInt(p_02,LitC);
        iVar1 = Gia_ManCreateOrGate(p_00,pVVar6);
        iVar1 = Abc_LitNotCond(iVar1,(uint)((LitC != 0 ^ 0xffU) & 1));
        Gia_ManAppendCo(p_00,iVar1);
      }
      Vec_VecFree(p_02);
      Gia_ManSetRegNum(p_00,nStates);
      Gia_ManHashStop(p_00);
      p_04 = Gia_ManCleanup(p_00);
      Gia_ManStop(p_00);
      iVar1 = Gia_ManHasDangling(p_04);
      if (iVar1 == 0) {
        return p_04;
      }
      __assert_fail("!Gia_ManHasDangling(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaStg.c"
                    ,0x188,"Gia_Man_t *Gia_ManStgOneHot(Vec_Int_t *, int, int, int)");
    }
    iVar1 = Vec_IntEntry(vLines,LitC);
    iVar2 = Vec_IntEntry(vLines,LitC + 1);
    iVar2 = iVar2 + -1;
    iVar3 = LitC + 3;
    iVar4 = Vec_IntEntry(vLines,LitC + 2);
    iVar4 = iVar4 + -1;
    LitC = LitC + 4;
    iVar3 = Vec_IntEntry(vLines,iVar3);
    if ((iVar1 < 0) || (1 << (bVar7 & 0x1f) <= iVar1)) {
      __assert_fail("iMint >= 0 && iMint < (1<<nIns)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaStg.c"
                    ,0x163,"Gia_Man_t *Gia_ManStgOneHot(Vec_Int_t *, int, int, int)");
    }
    if ((iVar2 < 0) || (nStates <= iVar2)) break;
    if ((iVar4 < 0) || (nStates <= iVar4)) {
      __assert_fail("iNext >= 0 && iNext < nStates",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaStg.c"
                    ,0x165,"Gia_Man_t *Gia_ManStgOneHot(Vec_Int_t *, int, int, int)");
    }
    if ((iVar3 < 0) || (1 << ((byte)nOuts & 0x1f) <= iVar3)) {
      __assert_fail("iOut >= 0 && iOut < (1<<nOuts)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaStg.c"
                    ,0x166,"Gia_Man_t *Gia_ManStgOneHot(Vec_Int_t *, int, int, int)");
    }
    iVar1 = Vec_IntEntry(pVVar6,iVar1);
    iVar2 = Vec_IntEntry(p_01,iVar2);
    iVar1 = Gia_ManHashAnd(p_00,iVar1,iVar2);
    Vec_VecPushInt(p_02,iVar4,iVar1);
    for (Lit = 0; Lit < nOuts; Lit = Lit + 1) {
      if ((iVar3 >> ((byte)Lit & 0x1f) & 1U) != 0) {
        Vec_VecPushInt(p_03,Lit,iVar1);
      }
    }
  }
  __assert_fail("iCur >= 0 && iCur < nStates",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaStg.c"
                ,0x164,"Gia_Man_t *Gia_ManStgOneHot(Vec_Int_t *, int, int, int)");
}

Assistant:

Gia_Man_t * Gia_ManStgOneHot( Vec_Int_t * vLines, int nIns, int nOuts, int nStates )
{
    Gia_Man_t * p, * pTemp;
    Vec_Int_t * vInMints, * vCurs, * vVec;
    Vec_Vec_t * vLitsNext, * vLitsOuts;
    int i, b, LitC, Lit;
    assert( Vec_IntSize(vLines) % 4 == 0 );

    // start manager
    p = Gia_ManStart( 10000 );
    p->pName = Abc_UtilStrsav( "stg" );
    for ( i = 0; i < nIns + nStates; i++ )
        Gia_ManAppendCi(p);

    // create input minterms
    Gia_ManHashAlloc( p );
    vInMints = Vec_IntAlloc( 1 << nIns );
    for ( i = 0; i < (1 << nIns); i++ )
    {
        for ( Lit = 1, b = 0; b < nIns; b++ )
            Lit = Gia_ManHashAnd( p, Lit, Abc_Var2Lit( b+1, !((i >> b) & 1) ) );
        Vec_IntPush( vInMints, Lit );
    } 

    // create current states
    vCurs  = Vec_IntAlloc( nStates );
    for ( i = 0; i < nStates; i++ )
        Vec_IntPush( vCurs, Abc_Var2Lit( 1+nIns+i, !i ) );

    // go through the lines
    vLitsNext = Vec_VecStart( nStates );
    vLitsOuts = Vec_VecStart( nOuts );
    for ( i = 0; i < Vec_IntSize(vLines); )
    {
        int iMint = Vec_IntEntry(vLines, i++);
        int iCur  = Vec_IntEntry(vLines, i++) - 1;
        int iNext = Vec_IntEntry(vLines, i++) - 1;
        int iOut  = Vec_IntEntry(vLines, i++);
        assert( iMint >= 0 && iMint < (1<<nIns)  );
        assert( iCur  >= 0 && iCur  < nStates    );
        assert( iNext >= 0 && iNext < nStates    );
        assert( iOut  >= 0 && iOut  < (1<<nOuts) );
        // create condition
        LitC = Gia_ManHashAnd( p, Vec_IntEntry(vInMints, iMint), Vec_IntEntry(vCurs, iCur) );
        // update next state
//        Lit = Gia_ManHashOr( p, LitC, Vec_IntEntry(vNexts, iNext) );
//        Vec_IntWriteEntry( vNexts, iNext, Lit );
        Vec_VecPushInt( vLitsNext, iNext, LitC );
        // update outputs
        for ( b = 0; b < nOuts; b++ )
            if ( (iOut >> b) & 1 ) 
            {
//                Lit = Gia_ManHashOr( p, LitC, Vec_IntEntry(vOuts, b) );
//                Vec_IntWriteEntry( vOuts, b, Lit );
                Vec_VecPushInt( vLitsOuts, b, LitC );
            }
    }
    Vec_IntFree( vInMints );
    Vec_IntFree( vCurs );

    // create POs
    Vec_VecForEachLevelInt( vLitsOuts, vVec, i )
        Gia_ManAppendCo( p, Gia_ManCreateOrGate(p, vVec) );
    Vec_VecFree( vLitsOuts );

    // create next states
    Vec_VecForEachLevelInt( vLitsNext, vVec, i )
        Gia_ManAppendCo( p, Abc_LitNotCond( Gia_ManCreateOrGate(p, vVec), !i ) );
    Vec_VecFree( vLitsNext );

    Gia_ManSetRegNum( p, nStates );
    Gia_ManHashStop( p );

    p = Gia_ManCleanup( pTemp = p );
    Gia_ManStop( pTemp );
    assert( !Gia_ManHasDangling(p) );
    return p;
}